

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kinsol_ls.c
# Opt level: O0

int KINSetJacFn(void *kinmem,KINLsJacFn jac)

{
  long in_RSI;
  int retval;
  KINLsMem kinls_mem;
  KINMem kin_mem;
  KINMem *in_stack_ffffffffffffffc8;
  undefined4 in_stack_ffffffffffffffd0;
  undefined4 in_stack_ffffffffffffffd4;
  void *in_stack_ffffffffffffffd8;
  KINMem local_20;
  int local_4;
  
  local_4 = kinLs_AccessLMem(in_stack_ffffffffffffffd8,
                             (char *)CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0),
                             in_stack_ffffffffffffffc8,(KINLsMem *)0x1154b9);
  if (local_4 == 0) {
    if ((in_RSI == 0) || (*(long *)((long)in_stack_ffffffffffffffd8 + 0x28) != 0)) {
      if (in_RSI == 0) {
        *(undefined4 *)((long)in_stack_ffffffffffffffd8 + 8) = 1;
        *(code **)((long)in_stack_ffffffffffffffd8 + 0x10) = kinLsDQJac;
        *(KINMem *)((long)in_stack_ffffffffffffffd8 + 0x18) = local_20;
      }
      else {
        *(undefined4 *)((long)in_stack_ffffffffffffffd8 + 8) = 0;
        *(long *)((long)in_stack_ffffffffffffffd8 + 0x10) = in_RSI;
        *(void **)((long)in_stack_ffffffffffffffd8 + 0x18) = local_20->kin_user_data;
      }
      local_4 = 0;
    }
    else {
      KINProcessError(local_20,-3,0xf6,"KINSetJacFn",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/opencor[P]sundials/src/kinsol/kinsol_ls.c"
                      ,"Jacobian routine cannot be supplied for NULL SUNMatrix");
      local_4 = -3;
    }
  }
  return local_4;
}

Assistant:

int KINSetJacFn(void* kinmem, KINLsJacFn jac)
{
  KINMem kin_mem;
  KINLsMem kinls_mem;
  int retval;

  /* access KINLsMem structure */
  retval = kinLs_AccessLMem(kinmem, __func__, &kin_mem, &kinls_mem);
  if (retval != KIN_SUCCESS) { return (retval); }

  /* return with failure if jac cannot be used */
  if ((jac != NULL) && (kinls_mem->J == NULL))
  {
    KINProcessError(kin_mem, KINLS_ILL_INPUT, __LINE__, __func__, __FILE__,
                    "Jacobian routine cannot be supplied for NULL SUNMatrix");
    return (KINLS_ILL_INPUT);
  }

  if (jac != NULL)
  {
    kinls_mem->jacDQ  = SUNFALSE;
    kinls_mem->jac    = jac;
    kinls_mem->J_data = kin_mem->kin_user_data;
  }
  else
  {
    kinls_mem->jacDQ  = SUNTRUE;
    kinls_mem->jac    = kinLsDQJac;
    kinls_mem->J_data = kin_mem;
  }

  return (KINLS_SUCCESS);
}